

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O3

int yaml_emitter_emit_node
              (yaml_emitter_t *emitter,yaml_event_t *event,int root,int sequence,int mapping,
              int simple_key)

{
  yaml_break_t yVar1;
  size_t sVar2;
  yaml_event_t *pyVar3;
  byte *pbVar4;
  int *piVar5;
  bool bVar6;
  yaml_string_t string;
  yaml_string_t string_00;
  bool bVar7;
  char cVar8;
  yaml_char_t yVar9;
  byte bVar10;
  int iVar11;
  yaml_emitter_state_t yVar12;
  int iVar13;
  int iVar14;
  yaml_emitter_state_t *pyVar15;
  char *pcVar16;
  yaml_char_t *pyVar17;
  yaml_char_t *pyVar18;
  long lVar19;
  yaml_scalar_style_t yVar20;
  byte *pbVar21;
  ulong uVar22;
  yaml_scalar_style_t yVar23;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  byte bVar27;
  uint uVar28;
  uint uVar29;
  byte *pbVar30;
  byte *pbVar31;
  
  emitter->root_context = root;
  emitter->sequence_context = sequence;
  emitter->mapping_context = mapping;
  emitter->simple_key_context = simple_key;
  switch(event->type) {
  case YAML_ALIAS_EVENT:
    iVar11 = yaml_emitter_process_anchor(emitter);
    if (iVar11 == 0) {
      return 0;
    }
    pyVar15 = (emitter->states).top;
    goto LAB_00107853;
  case YAML_SCALAR_EVENT:
    yVar20 = (event->data).scalar.style;
    if (((emitter->tag_data).handle == (yaml_char_t *)0x0) &&
       ((emitter->tag_data).suffix == (yaml_char_t *)0x0)) {
      bVar6 = true;
      if (((event->data).scalar.plain_implicit == 0) && ((event->data).scalar.quoted_implicit == 0))
      {
        emitter->error = YAML_EMITTER_ERROR;
        pcVar16 = "neither tag nor implicit flags are specified";
        goto LAB_00107ff5;
      }
    }
    else {
      bVar6 = false;
    }
    yVar20 = yVar20 + (yVar20 == YAML_ANY_SCALAR_STYLE);
    yVar23 = YAML_DOUBLE_QUOTED_SCALAR_STYLE;
    if (emitter->canonical != 0) {
      yVar20 = YAML_DOUBLE_QUOTED_SCALAR_STYLE;
    }
    if ((simple_key == 0) || ((emitter->scalar_data).multiline == 0)) {
      if (yVar20 == YAML_PLAIN_SCALAR_STYLE) {
        sVar2 = (emitter->scalar_data).length;
        if (emitter->flow_level == 0) {
          yVar20 = ((emitter->scalar_data).block_plain_allowed == 0) + YAML_PLAIN_SCALAR_STYLE;
          if (simple_key != 0 && sVar2 == 0) goto LAB_0010794a;
        }
        else {
          yVar20 = ((emitter->scalar_data).flow_plain_allowed == 0) + YAML_PLAIN_SCALAR_STYLE;
          if (sVar2 == 0) {
LAB_0010794a:
            yVar20 = YAML_SINGLE_QUOTED_SCALAR_STYLE;
          }
        }
        if ((!bVar6) || ((event->data).scalar.plain_implicit != 0)) goto LAB_0010795a;
LAB_00107961:
        yVar23 = ((emitter->scalar_data).single_quoted_allowed == 0) +
                 YAML_SINGLE_QUOTED_SCALAR_STYLE;
      }
      else {
LAB_0010795a:
        yVar23 = yVar20;
        if (yVar20 == YAML_SINGLE_QUOTED_SCALAR_STYLE) goto LAB_00107961;
      }
      if (((yVar23 & ~YAML_PLAIN_SCALAR_STYLE) == YAML_LITERAL_SCALAR_STYLE) &&
         (((emitter->scalar_data).block_allowed == 0 ||
          (simple_key != 0 || emitter->flow_level != 0)))) {
        yVar23 = YAML_DOUBLE_QUOTED_SCALAR_STYLE;
      }
    }
    if (((bVar6) && (yVar23 != YAML_PLAIN_SCALAR_STYLE)) &&
       ((event->data).scalar.quoted_implicit == 0)) {
      (emitter->tag_data).handle = "!";
      (emitter->tag_data).handle_length = 1;
    }
    (emitter->scalar_data).style = yVar23;
    iVar11 = yaml_emitter_process_anchor(emitter);
    if (iVar11 == 0) {
      return 0;
    }
    iVar11 = yaml_emitter_process_tag(emitter);
    if (iVar11 == 0) {
      return 0;
    }
    iVar11 = yaml_emitter_increase_indent(emitter,1,0);
    if (iVar11 == 0) {
      return 0;
    }
    break;
  case YAML_SEQUENCE_START_EVENT:
    iVar11 = yaml_emitter_process_anchor(emitter);
    if (iVar11 == 0) {
      return 0;
    }
    iVar11 = yaml_emitter_process_tag(emitter);
    if (iVar11 == 0) {
      return 0;
    }
    yVar12 = YAML_EMIT_FLOW_SEQUENCE_FIRST_ITEM_STATE;
    if (((emitter->flow_level == 0) && (emitter->canonical == 0)) &&
       (((event->data).sequence_start.style != YAML_FLOW_SEQUENCE_STYLE &&
        (((pyVar3 = (emitter->events).head, (long)(emitter->events).tail - (long)pyVar3 < 0xd0 ||
          (pyVar3->type != YAML_SEQUENCE_START_EVENT)) ||
         (pyVar3[1].type != YAML_SEQUENCE_END_EVENT)))))) {
      yVar12 = YAML_EMIT_BLOCK_SEQUENCE_FIRST_ITEM_STATE;
    }
    goto LAB_00107fdb;
  default:
    emitter->error = YAML_EMITTER_ERROR;
    pcVar16 = "expected SCALAR, SEQUENCE-START, MAPPING-START, or ALIAS";
LAB_00107ff5:
    emitter->problem = pcVar16;
    return 0;
  case YAML_MAPPING_START_EVENT:
    iVar11 = yaml_emitter_process_anchor(emitter);
    if (iVar11 == 0) {
      return 0;
    }
    iVar11 = yaml_emitter_process_tag(emitter);
    if (iVar11 == 0) {
      return 0;
    }
    yVar12 = YAML_EMIT_FLOW_MAPPING_FIRST_KEY_STATE;
    if ((((emitter->flow_level == 0) && (emitter->canonical == 0)) &&
        ((event->data).sequence_start.style != YAML_FLOW_SEQUENCE_STYLE)) &&
       (((pyVar3 = (emitter->events).head, (long)(emitter->events).tail - (long)pyVar3 < 0xd0 ||
         (pyVar3->type != YAML_MAPPING_START_EVENT)) || (pyVar3[1].type != YAML_MAPPING_END_EVENT)))
       ) {
      yVar12 = YAML_EMIT_BLOCK_MAPPING_FIRST_KEY_STATE;
    }
    goto LAB_00107fdb;
  }
  switch((emitter->scalar_data).style) {
  case YAML_PLAIN_SCALAR_STYLE:
    pbVar31 = (emitter->scalar_data).value;
    sVar2 = (emitter->scalar_data).length;
    iVar11 = emitter->simple_key_context;
    if (emitter->whitespace == 0) {
      pyVar18 = (emitter->buffer).pointer;
      if ((emitter->buffer).end <= pyVar18 + 5) {
        iVar13 = yaml_emitter_flush(emitter);
        if (iVar13 == 0) {
          return 0;
        }
        pyVar18 = (emitter->buffer).pointer;
      }
      (emitter->buffer).pointer = pyVar18 + 1;
      *pyVar18 = ' ';
      emitter->column = emitter->column + 1;
    }
    if (sVar2 != 0) {
      pbVar21 = pbVar31 + sVar2;
      bVar7 = false;
      bVar6 = false;
      do {
        bVar27 = *pbVar31;
        if (bVar27 < 0x20) {
          if ((bVar27 != 10) && (bVar27 != 0xd)) goto LAB_00107b98;
          pyVar18 = (emitter->buffer).end;
          pyVar17 = (emitter->buffer).pointer;
          if ((!bVar7) && (bVar27 == 10)) {
            if ((pyVar18 <= pyVar17 + 5) && (iVar13 = yaml_emitter_flush(emitter), iVar13 == 0)) {
              return 0;
            }
            yVar1 = emitter->line_break;
            if (yVar1 == YAML_CR_BREAK) {
              yVar9 = '\r';
LAB_00107c57:
              pyVar18 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pyVar18 + 1;
              *pyVar18 = yVar9;
            }
            else {
              if (yVar1 == YAML_CRLN_BREAK) {
                pyVar18 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pyVar18 + 1;
                *pyVar18 = '\r';
LAB_00107c51:
                yVar9 = '\n';
                goto LAB_00107c57;
              }
              if (yVar1 == YAML_LN_BREAK) goto LAB_00107c51;
            }
            emitter->column = 0;
            emitter->line = emitter->line + 1;
            goto LAB_00107c75;
          }
LAB_00107c7d:
          if ((pyVar18 <= pyVar17 + 5) && (iVar13 = yaml_emitter_flush(emitter), iVar13 == 0)) {
            return 0;
          }
          bVar27 = *pbVar31;
          if (bVar27 == 10) {
            if (((emitter->buffer).pointer + 5 < (emitter->buffer).end) ||
               (iVar13 = yaml_emitter_flush(emitter), iVar13 != 0)) {
              yVar1 = emitter->line_break;
              if (yVar1 == YAML_CR_BREAK) {
                yVar9 = '\r';
LAB_00107d19:
                pyVar18 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pyVar18 + 1;
                *pyVar18 = yVar9;
              }
              else {
                if (yVar1 == YAML_CRLN_BREAK) {
                  pyVar18 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pyVar18 + 1;
                  *pyVar18 = '\r';
LAB_00107d13:
                  yVar9 = '\n';
                  goto LAB_00107d19;
                }
                if (yVar1 == YAML_LN_BREAK) goto LAB_00107d13;
              }
              emitter->column = 0;
              emitter->line = emitter->line + 1;
            }
            pbVar31 = pbVar31 + 1;
          }
          else {
            if ((char)bVar27 < '\0') {
              if ((bVar27 & 0xe0) == 0xc0) {
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar31[1];
                pbVar31 = pbVar31 + 2;
                goto LAB_00107e60;
              }
              if ((bVar27 & 0xf0) == 0xe0) {
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar31[1];
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar31[2];
                pbVar31 = pbVar31 + 3;
                goto LAB_00107e60;
              }
              if ((bVar27 & 0xf8) == 0xf0) {
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar31[1];
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar31[2];
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar31[3];
                pbVar31 = pbVar31 + 4;
                goto LAB_00107e60;
              }
            }
            else {
              pbVar31 = pbVar31 + 1;
LAB_00107e60:
              pbVar30 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar30 + 1;
              *pbVar30 = bVar27;
            }
            emitter->column = 0;
            emitter->line = emitter->line + 1;
          }
          emitter->indention = 1;
          bVar7 = true;
        }
        else if (bVar27 == 0xe2) {
LAB_00107b98:
          if ((bVar7) && (iVar13 = yaml_emitter_write_indent(emitter), iVar13 == 0)) {
            return 0;
          }
          if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
             (iVar13 = yaml_emitter_flush(emitter), iVar13 == 0)) {
            return 0;
          }
          bVar27 = *pbVar31;
          if ((char)bVar27 < '\0') {
            if ((bVar27 & 0xe0) == 0xc0) {
              pbVar30 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar30 + 1;
              *pbVar30 = bVar27;
              bVar27 = pbVar31[1];
              pbVar31 = pbVar31 + 2;
              goto LAB_00107dc2;
            }
            if ((bVar27 & 0xf0) == 0xe0) {
              pbVar30 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar30 + 1;
              *pbVar30 = bVar27;
              bVar27 = pbVar31[1];
              pbVar30 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar30 + 1;
              *pbVar30 = bVar27;
              bVar27 = pbVar31[2];
              pbVar31 = pbVar31 + 3;
              goto LAB_00107dc2;
            }
            if ((bVar27 & 0xf8) == 0xf0) {
              pbVar30 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar30 + 1;
              *pbVar30 = bVar27;
              bVar27 = pbVar31[1];
              pbVar30 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar30 + 1;
              *pbVar30 = bVar27;
              bVar27 = pbVar31[2];
              pbVar30 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar30 + 1;
              *pbVar30 = bVar27;
              bVar27 = pbVar31[3];
              pbVar31 = pbVar31 + 4;
              goto LAB_00107dc2;
            }
          }
          else {
            pbVar31 = pbVar31 + 1;
LAB_00107dc2:
            pbVar30 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar30 + 1;
            *pbVar30 = bVar27;
          }
          emitter->column = emitter->column + 1;
          emitter->indention = 0;
          bVar6 = false;
          bVar7 = false;
        }
        else {
          if (bVar27 == 0xc2) {
            if (pbVar31[1] != 0x85) goto LAB_00107b98;
LAB_00107c75:
            pyVar18 = (emitter->buffer).end;
            pyVar17 = (emitter->buffer).pointer;
            goto LAB_00107c7d;
          }
          if (bVar27 != 0x20) goto LAB_00107b98;
          if (((bVar6 || iVar11 != 0) || (emitter->column <= emitter->best_width)) ||
             (pbVar31[1] == 0x20)) {
            bVar27 = 0x20;
            if ((emitter->buffer).pointer + 5 < (emitter->buffer).end) {
LAB_00107af2:
              pbVar31 = pbVar31 + 1;
LAB_00107af5:
              pbVar30 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar30 + 1;
              *pbVar30 = bVar27;
            }
            else {
              iVar13 = yaml_emitter_flush(emitter);
              if (iVar13 == 0) {
                return 0;
              }
              bVar27 = *pbVar31;
              if (-1 < (char)bVar27) goto LAB_00107af2;
              if ((bVar27 & 0xe0) == 0xc0) {
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar31[1];
                pbVar31 = pbVar31 + 2;
                goto LAB_00107af5;
              }
              if ((bVar27 & 0xf0) == 0xe0) {
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar31[1];
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar31[2];
                pbVar31 = pbVar31 + 3;
                goto LAB_00107af5;
              }
              if ((bVar27 & 0xf8) == 0xf0) {
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar31[1];
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar31[2];
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar31[3];
                pbVar31 = pbVar31 + 4;
                goto LAB_00107af5;
              }
            }
            emitter->column = emitter->column + 1;
          }
          else {
            iVar13 = yaml_emitter_write_indent(emitter);
            if (iVar13 == 0) {
              return 0;
            }
            bVar27 = *pbVar31;
            lVar25 = 1;
            if ((((char)bVar27 < '\0') && (lVar25 = 2, (bVar27 & 0xe0) != 0xc0)) &&
               (lVar25 = 3, (bVar27 & 0xf0) != 0xe0)) {
              lVar25 = (ulong)((bVar27 & 0xf8) == 0xf0) << 2;
            }
            pbVar31 = pbVar31 + lVar25;
          }
          bVar6 = true;
        }
      } while (pbVar31 != pbVar21);
    }
    emitter->whitespace = 0;
    emitter->indention = 0;
    if (emitter->root_context != 0) {
      emitter->open_ended = 1;
    }
    goto LAB_00109a4c;
  case YAML_SINGLE_QUOTED_SCALAR_STYLE:
    pbVar31 = (emitter->scalar_data).value;
    sVar2 = (emitter->scalar_data).length;
    iVar11 = emitter->simple_key_context;
    iVar13 = yaml_emitter_write_indicator(emitter,"\'",1,0,0);
    if (iVar13 == 0) {
      return 0;
    }
    if (sVar2 != 0) {
      pbVar30 = pbVar31 + sVar2;
      bVar6 = false;
      bVar27 = 0;
      pbVar21 = pbVar31;
LAB_00108c54:
      do {
        while (bVar10 = *pbVar21, bVar10 < 0x20) {
          if ((bVar10 != 10) && (bVar10 != 0xd)) goto LAB_00108f3d;
          pyVar18 = (emitter->buffer).end;
          pyVar17 = (emitter->buffer).pointer;
          if ((!bVar6) && (bVar10 == 10)) {
            if ((pyVar18 <= pyVar17 + 5) && (iVar13 = yaml_emitter_flush(emitter), iVar13 == 0)) {
              return 0;
            }
            yVar1 = emitter->line_break;
            if (yVar1 == YAML_CR_BREAK) {
              yVar9 = '\r';
LAB_00108d03:
              pyVar18 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pyVar18 + 1;
              *pyVar18 = yVar9;
            }
            else {
              if (yVar1 == YAML_CRLN_BREAK) {
                pyVar18 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pyVar18 + 1;
                *pyVar18 = '\r';
LAB_00108cfd:
                yVar9 = '\n';
                goto LAB_00108d03;
              }
              if (yVar1 == YAML_LN_BREAK) goto LAB_00108cfd;
            }
            emitter->column = 0;
            emitter->line = emitter->line + 1;
            goto LAB_00108d21;
          }
LAB_00108d29:
          if ((pyVar18 <= pyVar17 + 5) && (iVar13 = yaml_emitter_flush(emitter), iVar13 == 0)) {
            return 0;
          }
          bVar10 = *pbVar21;
          if (bVar10 == 10) {
            if (((emitter->buffer).pointer + 5 < (emitter->buffer).end) ||
               (iVar13 = yaml_emitter_flush(emitter), iVar13 != 0)) {
              yVar1 = emitter->line_break;
              if (yVar1 == YAML_CR_BREAK) {
                yVar9 = '\r';
LAB_00108dc5:
                pyVar18 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pyVar18 + 1;
                *pyVar18 = yVar9;
              }
              else {
                if (yVar1 == YAML_CRLN_BREAK) {
                  pyVar18 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pyVar18 + 1;
                  *pyVar18 = '\r';
LAB_00108dbf:
                  yVar9 = '\n';
                  goto LAB_00108dc5;
                }
                if (yVar1 == YAML_LN_BREAK) goto LAB_00108dbf;
              }
              emitter->column = 0;
              emitter->line = emitter->line + 1;
            }
            pbVar21 = pbVar21 + 1;
          }
          else {
            if ((char)bVar10 < '\0') {
              if ((bVar10 & 0xe0) == 0xc0) {
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar10;
                bVar10 = pbVar21[1];
                pbVar21 = pbVar21 + 2;
                goto LAB_00108e69;
              }
              if ((bVar10 & 0xf0) == 0xe0) {
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar10;
                bVar10 = pbVar21[1];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar10;
                bVar10 = pbVar21[2];
                pbVar21 = pbVar21 + 3;
                goto LAB_00108e69;
              }
              if ((bVar10 & 0xf8) == 0xf0) {
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar10;
                bVar10 = pbVar21[1];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar10;
                bVar10 = pbVar21[2];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar10;
                bVar10 = pbVar21[3];
                pbVar21 = pbVar21 + 4;
                goto LAB_00108e69;
              }
            }
            else {
              pbVar21 = pbVar21 + 1;
LAB_00108e69:
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar10;
            }
            emitter->column = 0;
            emitter->line = emitter->line + 1;
          }
          emitter->indention = 1;
          bVar6 = true;
          if (pbVar21 == pbVar30) goto LAB_00109a11;
        }
        if (bVar10 == 0xc2) {
          if (pbVar21[1] == 0x85) {
LAB_00108d21:
            pyVar18 = (emitter->buffer).end;
            pyVar17 = (emitter->buffer).pointer;
            goto LAB_00108d29;
          }
LAB_00108f3d:
          if (bVar6) {
            iVar13 = yaml_emitter_write_indent(emitter);
            if (iVar13 == 0) {
              return 0;
            }
            bVar10 = *pbVar21;
          }
          pyVar18 = (emitter->buffer).end;
          pyVar17 = (emitter->buffer).pointer;
          if (bVar10 == 0x27) {
            if (pyVar18 <= pyVar17 + 5) {
              iVar13 = yaml_emitter_flush(emitter);
              if (iVar13 == 0) {
                return 0;
              }
              pyVar17 = (emitter->buffer).pointer;
            }
            (emitter->buffer).pointer = pyVar17 + 1;
            *pyVar17 = '\'';
            emitter->column = emitter->column + 1;
            pyVar18 = (emitter->buffer).end;
            pyVar17 = (emitter->buffer).pointer;
          }
          if ((pyVar18 <= pyVar17 + 5) && (iVar13 = yaml_emitter_flush(emitter), iVar13 == 0)) {
            return 0;
          }
          bVar27 = *pbVar21;
          if ((char)bVar27 < '\0') {
            if ((bVar27 & 0xe0) == 0xc0) {
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar27;
              bVar27 = pbVar21[1];
              pbVar21 = pbVar21 + 2;
              goto LAB_00109062;
            }
            if ((bVar27 & 0xf0) == 0xe0) {
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar27;
              bVar27 = pbVar21[1];
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar27;
              bVar27 = pbVar21[2];
              pbVar21 = pbVar21 + 3;
              goto LAB_00109062;
            }
            if ((bVar27 & 0xf8) == 0xf0) {
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar27;
              bVar27 = pbVar21[1];
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar27;
              bVar27 = pbVar21[2];
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar27;
              bVar27 = pbVar21[3];
              pbVar21 = pbVar21 + 4;
              goto LAB_00109062;
            }
          }
          else {
            pbVar21 = pbVar21 + 1;
LAB_00109062:
            pbVar4 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar4 + 1;
            *pbVar4 = bVar27;
          }
          emitter->column = emitter->column + 1;
          emitter->indention = 0;
          bVar6 = false;
          bVar27 = 0;
          if (pbVar21 == pbVar30) goto LAB_00109a21;
          goto LAB_00108c54;
        }
        if ((bVar10 == 0xe2) || (bVar10 != 0x20)) goto LAB_00108f3d;
        if (((bool)(iVar11 != 0 | bVar27)) ||
           (((pbVar21 == pbVar30 + -1 || pbVar21 == pbVar31) ||
             emitter->column <= emitter->best_width || (pbVar21[1] == 0x20)))) {
          bVar27 = 0x20;
          if ((emitter->buffer).pointer + 5 < (emitter->buffer).end) {
LAB_00108f15:
            pbVar21 = pbVar21 + 1;
LAB_00108f18:
            pbVar4 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar4 + 1;
            *pbVar4 = bVar27;
          }
          else {
            iVar13 = yaml_emitter_flush(emitter);
            if (iVar13 == 0) {
              return 0;
            }
            bVar27 = *pbVar21;
            if (-1 < (char)bVar27) goto LAB_00108f15;
            if ((bVar27 & 0xe0) == 0xc0) {
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar27;
              bVar27 = pbVar21[1];
              pbVar21 = pbVar21 + 2;
              goto LAB_00108f18;
            }
            if ((bVar27 & 0xf0) == 0xe0) {
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar27;
              bVar27 = pbVar21[1];
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar27;
              bVar27 = pbVar21[2];
              pbVar21 = pbVar21 + 3;
              goto LAB_00108f18;
            }
            if ((bVar27 & 0xf8) == 0xf0) {
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar27;
              bVar27 = pbVar21[1];
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar27;
              bVar27 = pbVar21[2];
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar27;
              bVar27 = pbVar21[3];
              pbVar21 = pbVar21 + 4;
              goto LAB_00108f18;
            }
          }
          emitter->column = emitter->column + 1;
        }
        else {
          iVar13 = yaml_emitter_write_indent(emitter);
          if (iVar13 == 0) {
            return 0;
          }
          bVar27 = *pbVar21;
          lVar25 = 1;
          if ((((char)bVar27 < '\0') && (lVar25 = 2, (bVar27 & 0xe0) != 0xc0)) &&
             (lVar25 = 3, (bVar27 & 0xf0) != 0xe0)) {
            lVar25 = (ulong)((bVar27 & 0xf8) == 0xf0) << 2;
          }
          pbVar21 = pbVar21 + lVar25;
        }
        bVar27 = 1;
      } while (pbVar21 != pbVar30);
      if (bVar6) {
LAB_00109a11:
        iVar11 = yaml_emitter_write_indent(emitter);
        if (iVar11 == 0) {
          return 0;
        }
      }
    }
LAB_00109a21:
    pcVar16 = "\'";
    break;
  case YAML_DOUBLE_QUOTED_SCALAR_STYLE:
    pbVar31 = (emitter->scalar_data).value;
    sVar2 = (emitter->scalar_data).length;
    iVar11 = emitter->simple_key_context;
    iVar13 = yaml_emitter_write_indicator(emitter,"\"",1,0,0);
    if (iVar13 == 0) {
      return 0;
    }
    if (sVar2 != 0) {
      bVar6 = false;
      pbVar21 = pbVar31;
      do {
        bVar27 = *pbVar21;
        uVar29 = (uint)bVar27;
        if (bVar27 == 10) {
LAB_00108174:
          lVar25 = 1;
LAB_0010817a:
          pyVar18 = (emitter->buffer).pointer;
          if ((emitter->buffer).end <= pyVar18 + 5) {
            iVar13 = yaml_emitter_flush(emitter);
            if (iVar13 == 0) {
              return 0;
            }
            pyVar18 = (emitter->buffer).pointer;
          }
          pbVar21 = pbVar21 + lVar25;
          (emitter->buffer).pointer = pyVar18 + 1;
          *pyVar18 = '\\';
          emitter->column = emitter->column + 1;
          if ((int)uVar29 < 0x1b) {
            switch(uVar29) {
            case 0:
              pyVar18 = (emitter->buffer).pointer;
              if ((emitter->buffer).end <= pyVar18 + 5) {
                iVar13 = yaml_emitter_flush(emitter);
                if (iVar13 == 0) {
                  return 0;
                }
                pyVar18 = (emitter->buffer).pointer;
              }
              (emitter->buffer).pointer = pyVar18 + 1;
              *pyVar18 = '0';
              break;
            default:
              goto switchD_001081d5_caseD_1;
            case 7:
              pyVar18 = (emitter->buffer).pointer;
              if ((emitter->buffer).end <= pyVar18 + 5) {
                iVar13 = yaml_emitter_flush(emitter);
                if (iVar13 == 0) {
                  return 0;
                }
                pyVar18 = (emitter->buffer).pointer;
              }
              (emitter->buffer).pointer = pyVar18 + 1;
              *pyVar18 = 'a';
              break;
            case 8:
              pyVar18 = (emitter->buffer).pointer;
              if ((emitter->buffer).end <= pyVar18 + 5) {
                iVar13 = yaml_emitter_flush(emitter);
                if (iVar13 == 0) {
                  return 0;
                }
                pyVar18 = (emitter->buffer).pointer;
              }
              (emitter->buffer).pointer = pyVar18 + 1;
              *pyVar18 = 'b';
              break;
            case 9:
              pyVar18 = (emitter->buffer).pointer;
              if ((emitter->buffer).end <= pyVar18 + 5) {
                iVar13 = yaml_emitter_flush(emitter);
                if (iVar13 == 0) {
                  return 0;
                }
                pyVar18 = (emitter->buffer).pointer;
              }
              (emitter->buffer).pointer = pyVar18 + 1;
              *pyVar18 = 't';
              break;
            case 10:
              pyVar18 = (emitter->buffer).pointer;
              if ((emitter->buffer).end <= pyVar18 + 5) {
                iVar13 = yaml_emitter_flush(emitter);
                if (iVar13 == 0) {
                  return 0;
                }
                pyVar18 = (emitter->buffer).pointer;
              }
              (emitter->buffer).pointer = pyVar18 + 1;
              *pyVar18 = 'n';
              break;
            case 0xb:
              pyVar18 = (emitter->buffer).pointer;
              if ((emitter->buffer).end <= pyVar18 + 5) {
                iVar13 = yaml_emitter_flush(emitter);
                if (iVar13 == 0) {
                  return 0;
                }
                pyVar18 = (emitter->buffer).pointer;
              }
              (emitter->buffer).pointer = pyVar18 + 1;
              *pyVar18 = 'v';
              break;
            case 0xc:
              pyVar18 = (emitter->buffer).pointer;
              if ((emitter->buffer).end <= pyVar18 + 5) {
                iVar13 = yaml_emitter_flush(emitter);
                if (iVar13 == 0) {
                  return 0;
                }
                pyVar18 = (emitter->buffer).pointer;
              }
              (emitter->buffer).pointer = pyVar18 + 1;
              *pyVar18 = 'f';
              break;
            case 0xd:
              pyVar18 = (emitter->buffer).pointer;
              if ((emitter->buffer).end <= pyVar18 + 5) {
                iVar13 = yaml_emitter_flush(emitter);
                if (iVar13 == 0) {
                  return 0;
                }
                pyVar18 = (emitter->buffer).pointer;
              }
              (emitter->buffer).pointer = pyVar18 + 1;
              *pyVar18 = 'r';
            }
          }
          else if ((int)uVar29 < 0x85) {
            if (uVar29 == 0x1b) {
              pyVar18 = (emitter->buffer).pointer;
              if ((emitter->buffer).end <= pyVar18 + 5) {
                iVar13 = yaml_emitter_flush(emitter);
                if (iVar13 == 0) {
                  return 0;
                }
                pyVar18 = (emitter->buffer).pointer;
              }
              (emitter->buffer).pointer = pyVar18 + 1;
              *pyVar18 = 'e';
            }
            else if (uVar29 == 0x22) {
              pyVar18 = (emitter->buffer).pointer;
              if ((emitter->buffer).end <= pyVar18 + 5) {
                iVar13 = yaml_emitter_flush(emitter);
                if (iVar13 == 0) {
                  return 0;
                }
                pyVar18 = (emitter->buffer).pointer;
              }
              (emitter->buffer).pointer = pyVar18 + 1;
              *pyVar18 = '\"';
            }
            else {
              if (uVar29 != 0x5c) goto switchD_001081d5_caseD_1;
              pyVar18 = (emitter->buffer).pointer;
              if ((emitter->buffer).end <= pyVar18 + 5) {
                iVar13 = yaml_emitter_flush(emitter);
                if (iVar13 == 0) {
                  return 0;
                }
                pyVar18 = (emitter->buffer).pointer;
              }
              (emitter->buffer).pointer = pyVar18 + 1;
              *pyVar18 = '\\';
            }
          }
          else if ((int)uVar29 < 0x2028) {
            if (uVar29 == 0x85) {
              pyVar18 = (emitter->buffer).pointer;
              if ((emitter->buffer).end <= pyVar18 + 5) {
                iVar13 = yaml_emitter_flush(emitter);
                if (iVar13 == 0) {
                  return 0;
                }
                pyVar18 = (emitter->buffer).pointer;
              }
              (emitter->buffer).pointer = pyVar18 + 1;
              *pyVar18 = 'N';
            }
            else {
              if (uVar29 != 0xa0) {
switchD_001081d5_caseD_1:
                if (uVar29 < 0x100) {
                  pyVar18 = (emitter->buffer).pointer;
                  if ((emitter->buffer).end <= pyVar18 + 5) {
                    iVar13 = yaml_emitter_flush(emitter);
                    if (iVar13 == 0) {
                      return 0;
                    }
                    pyVar18 = (emitter->buffer).pointer;
                  }
                  (emitter->buffer).pointer = pyVar18 + 1;
                  *pyVar18 = 'x';
                  iVar13 = 4;
                }
                else {
                  pyVar18 = (emitter->buffer).end;
                  pyVar17 = (emitter->buffer).pointer;
                  if (uVar29 < 0x10000) {
                    if (pyVar18 <= pyVar17 + 5) {
                      iVar13 = yaml_emitter_flush(emitter);
                      if (iVar13 == 0) {
                        return 0;
                      }
                      pyVar17 = (emitter->buffer).pointer;
                    }
                    (emitter->buffer).pointer = pyVar17 + 1;
                    *pyVar17 = 'u';
                    iVar13 = 0xc;
                  }
                  else {
                    if (pyVar18 <= pyVar17 + 5) {
                      iVar13 = yaml_emitter_flush(emitter);
                      if (iVar13 == 0) {
                        return 0;
                      }
                      pyVar17 = (emitter->buffer).pointer;
                    }
                    (emitter->buffer).pointer = pyVar17 + 1;
                    *pyVar17 = 'U';
                    iVar13 = 0x1c;
                  }
                }
                emitter->column = emitter->column + 1;
                do {
                  pyVar18 = (emitter->buffer).pointer;
                  if ((emitter->buffer).end <= pyVar18 + 5) {
                    iVar14 = yaml_emitter_flush(emitter);
                    if (iVar14 == 0) {
                      return 0;
                    }
                    pyVar18 = (emitter->buffer).pointer;
                  }
                  uVar26 = uVar29 >> ((byte)iVar13 & 0x1f) & 0xf;
                  cVar8 = (char)uVar26;
                  yVar9 = cVar8 + '0';
                  if (9 < uVar26) {
                    yVar9 = cVar8 + '7';
                  }
                  (emitter->buffer).pointer = pyVar18 + 1;
                  *pyVar18 = yVar9;
                  emitter->column = emitter->column + 1;
                  bVar6 = 3 < iVar13;
                  iVar13 = iVar13 + -4;
                } while (bVar6);
                bVar6 = false;
                goto LAB_00108964;
              }
              pyVar18 = (emitter->buffer).pointer;
              if ((emitter->buffer).end <= pyVar18 + 5) {
                iVar13 = yaml_emitter_flush(emitter);
                if (iVar13 == 0) {
                  return 0;
                }
                pyVar18 = (emitter->buffer).pointer;
              }
              (emitter->buffer).pointer = pyVar18 + 1;
              *pyVar18 = '_';
            }
          }
          else if (uVar29 == 0x2028) {
            pyVar18 = (emitter->buffer).pointer;
            if ((emitter->buffer).end <= pyVar18 + 5) {
              iVar13 = yaml_emitter_flush(emitter);
              if (iVar13 == 0) {
                return 0;
              }
              pyVar18 = (emitter->buffer).pointer;
            }
            (emitter->buffer).pointer = pyVar18 + 1;
            *pyVar18 = 'L';
          }
          else {
            if (uVar29 != 0x2029) goto switchD_001081d5_caseD_1;
            pyVar18 = (emitter->buffer).pointer;
            if ((emitter->buffer).end <= pyVar18 + 5) {
              iVar13 = yaml_emitter_flush(emitter);
              if (iVar13 == 0) {
                return 0;
              }
              pyVar18 = (emitter->buffer).pointer;
            }
            (emitter->buffer).pointer = pyVar18 + 1;
            *pyVar18 = 'P';
          }
LAB_0010895c:
          emitter->column = emitter->column + 1;
          bVar6 = false;
        }
        else {
          uVar26 = (uint)bVar27;
          uVar28 = (uint)bVar27;
          if (0x5e < (byte)(bVar27 - 0x20)) {
            if (bVar27 == 0xc2) {
              if (pbVar21[1] < 0xa0) goto LAB_00108a4d;
              goto LAB_00108216;
            }
            if ((byte)(bVar27 + 0x3d) < 0x2a) goto LAB_00108216;
            if (bVar27 != 0xef) {
              if (uVar26 != 0xee) {
                if (uVar26 == 0xed) {
                  if (pbVar21[1] < 0xa0) goto LAB_00108216;
                }
                else if (-1 < (char)bVar27) goto LAB_00108174;
                goto LAB_00108a4d;
              }
              goto LAB_00108216;
            }
            if (pbVar21[1] == 0xbf) {
              if ((pbVar21[2] & 0xfe) != 0xbe) goto LAB_00108216;
            }
            else if ((pbVar21[1] != 0xbb) || (pbVar21[2] != 0xbf)) goto LAB_00108216;
LAB_00108a4d:
            if ((uVar26 & 0xffffffe0) == 0xc0) {
              uVar29 = uVar28 & 0x1f;
              lVar25 = 2;
            }
            else if ((uVar28 & 0xfffffff0) == 0xe0) {
              uVar29 = uVar26 & 0xf;
              lVar25 = 3;
            }
            else {
              if ((uVar28 & 0xfffffff8) != 0xf0) {
                lVar25 = 0;
                uVar29 = 0;
                goto LAB_0010817a;
              }
              uVar29 = uVar26 & 7;
              lVar25 = 4;
            }
            lVar19 = 1;
            do {
              uVar29 = pbVar21[lVar19] & 0x3f | uVar29 << 6;
              lVar19 = lVar19 + 1;
            } while (lVar25 != lVar19);
            goto LAB_0010817a;
          }
LAB_00108216:
          if (emitter->unicode == 0) {
            if (-1 < (char)bVar27) {
              if (bVar27 < 0x20) goto LAB_00108416;
              if (uVar26 == 0x20) goto LAB_001086cf;
              if ((uVar28 != 0x22) && (uVar28 != 0x5c)) goto LAB_0010875e;
              goto LAB_00108174;
            }
            goto LAB_00108a4d;
          }
          if (uVar28 != 0x5b && 0x5a < bVar27) {
            if (uVar28 < 0xe2) {
              if (uVar28 == 0x5c) goto LAB_00108174;
              if ((uVar28 == 0xc2) && (pbVar21[1] == 0x85)) goto LAB_00108a4d;
            }
            else if ((((uVar28 != 0xe2) && (uVar28 == 0xef)) && (pbVar21[1] == 0xbb)) &&
                    (pbVar21[2] == 0xbf)) goto LAB_00108a4d;
LAB_0010875e:
            if ((emitter->buffer).end <= (emitter->buffer).pointer + 5) {
              iVar13 = yaml_emitter_flush(emitter);
              if (iVar13 == 0) {
                return 0;
              }
              uVar29 = (uint)*pbVar21;
            }
            bVar27 = (byte)uVar29;
            if ((char)bVar27 < '\0') {
              if ((uVar29 & 0xffffffe0) == 0xc0) {
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar21[1];
                pbVar21 = pbVar21 + 2;
                goto LAB_0010894d;
              }
              if ((uVar29 & 0xfffffff0) == 0xe0) {
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar21[1];
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar21[2];
                pbVar21 = pbVar21 + 3;
                goto LAB_0010894d;
              }
              if ((uVar29 & 0xfffffff8) == 0xf0) {
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar21[1];
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar21[2];
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar21[3];
                pbVar21 = pbVar21 + 4;
                goto LAB_0010894d;
              }
            }
            else {
              pbVar21 = pbVar21 + 1;
LAB_0010894d:
              pbVar30 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar30 + 1;
              *pbVar30 = bVar27;
            }
            goto LAB_0010895c;
          }
          if (bVar27 < 0x20) {
LAB_00108416:
            if ((uVar26 != 10) && (uVar26 != 0xd)) goto LAB_0010875e;
            goto LAB_00108174;
          }
          if (uVar28 != 0x20) {
            if (uVar26 != 0x22) goto LAB_0010875e;
            goto LAB_00108174;
          }
LAB_001086cf:
          if ((bVar6 || iVar11 != 0) ||
             ((pbVar21 == pbVar31 + sVar2 + -1 || pbVar21 == pbVar31) ||
              emitter->column <= emitter->best_width)) {
            bVar27 = 0x20;
            if ((emitter->buffer).pointer + 5 < (emitter->buffer).end) {
LAB_00108729:
              pbVar21 = pbVar21 + 1;
LAB_0010872c:
              pbVar30 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar30 + 1;
              *pbVar30 = bVar27;
            }
            else {
              iVar13 = yaml_emitter_flush(emitter);
              if (iVar13 == 0) {
                return 0;
              }
              bVar27 = *pbVar21;
              if (-1 < (char)bVar27) goto LAB_00108729;
              if ((bVar27 & 0xe0) == 0xc0) {
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar21[1];
                pbVar21 = pbVar21 + 2;
                goto LAB_0010872c;
              }
              if ((bVar27 & 0xf0) == 0xe0) {
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar21[1];
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar21[2];
                pbVar21 = pbVar21 + 3;
                goto LAB_0010872c;
              }
              if ((bVar27 & 0xf8) == 0xf0) {
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar21[1];
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar21[2];
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar21[3];
                pbVar21 = pbVar21 + 4;
                goto LAB_0010872c;
              }
            }
            emitter->column = emitter->column + 1;
            bVar6 = true;
          }
          else {
            iVar13 = yaml_emitter_write_indent(emitter);
            if (iVar13 == 0) {
              return 0;
            }
            if (pbVar21[1] == 0x20) {
              pyVar18 = (emitter->buffer).pointer;
              if ((emitter->buffer).end <= pyVar18 + 5) {
                iVar13 = yaml_emitter_flush(emitter);
                if (iVar13 == 0) {
                  return 0;
                }
                pyVar18 = (emitter->buffer).pointer;
              }
              (emitter->buffer).pointer = pyVar18 + 1;
              *pyVar18 = '\\';
              emitter->column = emitter->column + 1;
            }
            bVar27 = *pbVar21;
            lVar25 = 1;
            if ((((char)bVar27 < '\0') && (lVar25 = 2, (bVar27 & 0xe0) != 0xc0)) &&
               (lVar25 = 3, (bVar27 & 0xf0) != 0xe0)) {
              lVar25 = (ulong)((bVar27 & 0xf8) == 0xf0) << 2;
            }
            pbVar21 = pbVar21 + lVar25;
            bVar6 = true;
          }
        }
LAB_00108964:
      } while (pbVar21 != pbVar31 + sVar2);
    }
    pcVar16 = "\"";
    break;
  case YAML_LITERAL_SCALAR_STYLE:
    pbVar31 = (emitter->scalar_data).value;
    pbVar21 = pbVar31 + (emitter->scalar_data).length;
    bVar6 = false;
    iVar11 = yaml_emitter_write_indicator(emitter,"|",1,0,0);
    if (((iVar11 != 0) &&
        (string_00.end = pbVar21, string_00.start = pbVar31, string_00.pointer = pbVar31,
        iVar11 = yaml_emitter_write_block_scalar_hints(emitter,string_00), iVar11 != 0)) &&
       (((emitter->buffer).pointer + 5 < (emitter->buffer).end ||
        (iVar11 = yaml_emitter_flush(emitter), iVar11 != 0)))) {
      yVar1 = emitter->line_break;
      if (yVar1 == YAML_CR_BREAK) {
        yVar9 = '\r';
LAB_001096bf:
        pyVar18 = (emitter->buffer).pointer;
        (emitter->buffer).pointer = pyVar18 + 1;
        *pyVar18 = yVar9;
      }
      else {
        if (yVar1 == YAML_CRLN_BREAK) {
          pyVar18 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pyVar18 + 1;
          *pyVar18 = '\r';
LAB_001096b9:
          yVar9 = '\n';
          goto LAB_001096bf;
        }
        if (yVar1 == YAML_LN_BREAK) goto LAB_001096b9;
      }
      emitter->column = 0;
      emitter->whitespace = 1;
      emitter->line = emitter->line + 1;
      emitter->indention = 1;
      if (pbVar31 != pbVar21) {
        iVar11 = 1;
        do {
          bVar27 = *pbVar31;
          if (bVar27 < 0xc2) {
            if ((bVar27 != 10) && (bVar27 != 0xd)) goto LAB_001097c6;
LAB_00109759:
            if ((emitter->buffer).end <= (emitter->buffer).pointer + 5) {
              iVar11 = yaml_emitter_flush(emitter);
              if (iVar11 == 0) goto LAB_00109a00;
              bVar27 = *pbVar31;
            }
            if (bVar27 == 10) {
              if (((emitter->buffer).pointer + 5 < (emitter->buffer).end) ||
                 (iVar11 = yaml_emitter_flush(emitter), iVar11 != 0)) {
                yVar1 = emitter->line_break;
                if (yVar1 == YAML_CR_BREAK) {
                  yVar9 = '\r';
LAB_001098c0:
                  pyVar18 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pyVar18 + 1;
                  *pyVar18 = yVar9;
                }
                else {
                  if (yVar1 == YAML_CRLN_BREAK) {
                    pyVar18 = (emitter->buffer).pointer;
                    (emitter->buffer).pointer = pyVar18 + 1;
                    *pyVar18 = '\r';
LAB_001098ba:
                    yVar9 = '\n';
                    goto LAB_001098c0;
                  }
                  if (yVar1 == YAML_LN_BREAK) goto LAB_001098ba;
                }
                emitter->column = 0;
                emitter->line = emitter->line + 1;
              }
              pbVar31 = pbVar31 + 1;
            }
            else {
              if ((char)bVar27 < '\0') {
                if ((bVar27 & 0xe0) == 0xc0) {
                  pbVar30 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar30 + 1;
                  *pbVar30 = bVar27;
                  bVar27 = pbVar31[1];
                  pbVar31 = pbVar31 + 2;
                  goto LAB_001099c6;
                }
                if ((bVar27 & 0xf0) == 0xe0) {
                  pbVar30 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar30 + 1;
                  *pbVar30 = bVar27;
                  bVar27 = pbVar31[1];
                  pbVar30 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar30 + 1;
                  *pbVar30 = bVar27;
                  bVar27 = pbVar31[2];
                  pbVar31 = pbVar31 + 3;
                  goto LAB_001099c6;
                }
                if ((bVar27 & 0xf8) == 0xf0) {
                  pbVar30 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar30 + 1;
                  *pbVar30 = bVar27;
                  bVar27 = pbVar31[1];
                  pbVar30 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar30 + 1;
                  *pbVar30 = bVar27;
                  bVar27 = pbVar31[2];
                  pbVar30 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar30 + 1;
                  *pbVar30 = bVar27;
                  bVar27 = pbVar31[3];
                  pbVar31 = pbVar31 + 4;
                  goto LAB_001099c6;
                }
              }
              else {
                pbVar31 = pbVar31 + 1;
LAB_001099c6:
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
              }
              emitter->column = 0;
              emitter->line = emitter->line + 1;
            }
            iVar11 = 1;
          }
          else {
            if (((bVar27 != 0xe2) && (bVar27 == 0xc2)) && (pbVar31[1] == 0x85)) goto LAB_00109759;
LAB_001097c6:
            if (((iVar11 != 0) && (iVar11 = yaml_emitter_write_indent(emitter), iVar11 == 0)) ||
               (((emitter->buffer).end <= (emitter->buffer).pointer + 5 &&
                (iVar11 = yaml_emitter_flush(emitter), iVar11 == 0)))) goto LAB_00109a00;
            bVar27 = *pbVar31;
            if ((char)bVar27 < '\0') {
              if ((bVar27 & 0xe0) == 0xc0) {
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar31[1];
                pbVar31 = pbVar31 + 2;
                goto LAB_00109969;
              }
              if ((bVar27 & 0xf0) == 0xe0) {
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar31[1];
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar31[2];
                pbVar31 = pbVar31 + 3;
                goto LAB_00109969;
              }
              if ((bVar27 & 0xf8) == 0xf0) {
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar31[1];
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar31[2];
                pbVar30 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar30 + 1;
                *pbVar30 = bVar27;
                bVar27 = pbVar31[3];
                pbVar31 = pbVar31 + 4;
                goto LAB_00109969;
              }
            }
            else {
              pbVar31 = pbVar31 + 1;
LAB_00109969:
              pbVar30 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar30 + 1;
              *pbVar30 = bVar27;
            }
            emitter->column = emitter->column + 1;
            iVar11 = 0;
          }
          emitter->indention = iVar11;
        } while (pbVar31 != pbVar21);
      }
      goto LAB_001099f8;
    }
    goto LAB_00109a03;
  case YAML_FOLDED_SCALAR_STYLE:
    pbVar31 = (emitter->scalar_data).value;
    pbVar21 = pbVar31 + (emitter->scalar_data).length;
    bVar6 = false;
    iVar11 = yaml_emitter_write_indicator(emitter,">",1,0,0);
    if (((iVar11 == 0) ||
        (string.end = pbVar21, string.start = pbVar31, string.pointer = pbVar31,
        iVar11 = yaml_emitter_write_block_scalar_hints(emitter,string), iVar11 == 0)) ||
       (((emitter->buffer).end <= (emitter->buffer).pointer + 5 &&
        (iVar11 = yaml_emitter_flush(emitter), iVar11 == 0)))) goto LAB_00109a03;
    yVar1 = emitter->line_break;
    if (yVar1 == YAML_CR_BREAK) {
      yVar9 = '\r';
LAB_001091ea:
      pyVar18 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar18 + 1;
      *pyVar18 = yVar9;
    }
    else {
      if (yVar1 == YAML_CRLN_BREAK) {
        pyVar18 = (emitter->buffer).pointer;
        (emitter->buffer).pointer = pyVar18 + 1;
        *pyVar18 = '\r';
LAB_001091e4:
        yVar9 = '\n';
        goto LAB_001091ea;
      }
      if (yVar1 == YAML_LN_BREAK) goto LAB_001091e4;
    }
    emitter->column = 0;
    emitter->whitespace = 1;
    emitter->line = emitter->line + 1;
    emitter->indention = 1;
    if (pbVar31 != pbVar21) {
      bVar6 = true;
      iVar11 = 1;
LAB_0010923d:
      bVar27 = *pbVar31;
      if (bVar27 < 0xc2) {
        if ((bVar27 != 10) && (bVar27 != 0xd)) goto LAB_0010932b;
        if ((iVar11 == 0) && ((!bVar6 && (bVar27 == 10)))) {
          uVar22 = 0;
          uVar24 = 10;
          do {
            if ((byte)uVar24 < 0x21) {
              lVar25 = 1;
              if ((0x2400UL >> (uVar24 & 0x3f) & 1) == 0) {
                if ((0x100000201U >> (uVar24 & 0x3f) & 1) == 0) goto LAB_001092a3;
                break;
              }
            }
            else {
LAB_001092a3:
              if ((((int)uVar24 == 0xe2) || ((int)uVar24 != 0xc2)) ||
                 (lVar25 = 2, pbVar31[(uVar22 & 0xffffffff) + 1] != 0x85)) goto LAB_00109420;
            }
            uVar22 = lVar25 + (uVar22 & 0xffffffff);
            uVar24 = (ulong)pbVar31[uVar22];
          } while( true );
        }
        goto LAB_0010952e;
      }
      if (((bVar27 != 0xe2) && (bVar27 == 0xc2)) && (pbVar31[1] == 0x85)) goto LAB_0010952e;
LAB_0010932b:
      if (iVar11 == 0) {
        if (((bVar27 != 0x20) || (bVar27 = 0x20, pbVar31[1] == 0x20)) ||
           (emitter->column <= emitter->best_width)) goto LAB_001093c8;
        iVar11 = yaml_emitter_write_indent(emitter);
        if (iVar11 == 0) goto LAB_00109a00;
        bVar27 = *pbVar31;
        lVar25 = 1;
        if ((((char)bVar27 < '\0') && (lVar25 = 2, (bVar27 & 0xe0) != 0xc0)) &&
           (lVar25 = 3, (bVar27 & 0xf0) != 0xe0)) {
          lVar25 = (ulong)((bVar27 & 0xf8) == 0xf0) << 2;
        }
        pbVar31 = pbVar31 + lVar25;
      }
      else {
        iVar11 = yaml_emitter_write_indent(emitter);
        if (iVar11 == 0) goto LAB_00109a00;
        bVar27 = *pbVar31;
        bVar6 = bVar27 == 9 || bVar27 == 0x20;
LAB_001093c8:
        if ((emitter->buffer).end <= (emitter->buffer).pointer + 5) {
          iVar11 = yaml_emitter_flush(emitter);
          if (iVar11 == 0) goto LAB_00109a00;
          bVar27 = *pbVar31;
        }
        if ((char)bVar27 < '\0') {
          if ((bVar27 & 0xe0) == 0xc0) {
            pbVar30 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar30 + 1;
            *pbVar30 = bVar27;
            bVar27 = pbVar31[1];
            pbVar31 = pbVar31 + 2;
            goto LAB_001094e0;
          }
          if ((bVar27 & 0xf0) == 0xe0) {
            pbVar30 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar30 + 1;
            *pbVar30 = bVar27;
            bVar27 = pbVar31[1];
            pbVar30 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar30 + 1;
            *pbVar30 = bVar27;
            bVar27 = pbVar31[2];
            pbVar31 = pbVar31 + 3;
            goto LAB_001094e0;
          }
          if ((bVar27 & 0xf8) == 0xf0) {
            pbVar30 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar30 + 1;
            *pbVar30 = bVar27;
            bVar27 = pbVar31[1];
            pbVar30 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar30 + 1;
            *pbVar30 = bVar27;
            bVar27 = pbVar31[2];
            pbVar30 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar30 + 1;
            *pbVar30 = bVar27;
            bVar27 = pbVar31[3];
            pbVar31 = pbVar31 + 4;
            goto LAB_001094e0;
          }
        }
        else {
          pbVar31 = pbVar31 + 1;
LAB_001094e0:
          pbVar30 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar30 + 1;
          *pbVar30 = bVar27;
        }
        emitter->column = emitter->column + 1;
      }
      iVar11 = 0;
      goto LAB_00109696;
    }
LAB_001099f8:
    bVar6 = true;
LAB_00109a03:
    if (!bVar6) {
      return 0;
    }
    goto LAB_00109a4c;
  default:
    return 0;
  }
  iVar11 = yaml_emitter_write_indicator(emitter,pcVar16,0,0,0);
  if (iVar11 == 0) {
    return 0;
  }
  emitter->whitespace = 0;
  emitter->indention = 0;
LAB_00109a4c:
  pyVar15 = (emitter->states).top;
  piVar5 = (emitter->indents).top;
  (emitter->indents).top = piVar5 + -1;
  emitter->indent = piVar5[-1];
LAB_00107853:
  (emitter->states).top = pyVar15 + -1;
  yVar12 = pyVar15[-1];
LAB_00107fdb:
  emitter->state = yVar12;
  return 1;
LAB_00109420:
  if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
     (iVar11 = yaml_emitter_flush(emitter), iVar11 == 0)) goto LAB_00109a00;
  yVar1 = emitter->line_break;
  if (yVar1 == YAML_CR_BREAK) {
    yVar9 = '\r';
LAB_00109510:
    pyVar18 = (emitter->buffer).pointer;
    (emitter->buffer).pointer = pyVar18 + 1;
    *pyVar18 = yVar9;
  }
  else {
    if (yVar1 == YAML_CRLN_BREAK) {
      pyVar18 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar18 + 1;
      *pyVar18 = '\r';
LAB_0010950a:
      yVar9 = '\n';
      goto LAB_00109510;
    }
    if (yVar1 == YAML_LN_BREAK) goto LAB_0010950a;
  }
  emitter->column = 0;
  emitter->line = emitter->line + 1;
LAB_0010952e:
  if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
     (iVar11 = yaml_emitter_flush(emitter), iVar11 == 0)) goto LAB_00109a00;
  bVar27 = *pbVar31;
  if (bVar27 == 10) {
    if (((emitter->buffer).pointer + 5 < (emitter->buffer).end) ||
       (iVar11 = yaml_emitter_flush(emitter), iVar11 != 0)) {
      yVar1 = emitter->line_break;
      if (yVar1 == YAML_CR_BREAK) {
        yVar9 = '\r';
LAB_001095cf:
        pyVar18 = (emitter->buffer).pointer;
        (emitter->buffer).pointer = pyVar18 + 1;
        *pyVar18 = yVar9;
      }
      else {
        if (yVar1 == YAML_CRLN_BREAK) {
          pyVar18 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pyVar18 + 1;
          *pyVar18 = '\r';
LAB_001095c9:
          yVar9 = '\n';
          goto LAB_001095cf;
        }
        if (yVar1 == YAML_LN_BREAK) goto LAB_001095c9;
      }
      emitter->column = 0;
      emitter->line = emitter->line + 1;
    }
    pbVar31 = pbVar31 + 1;
    goto LAB_00109691;
  }
  if ((char)bVar27 < '\0') {
    if ((bVar27 & 0xe0) == 0xc0) {
      pbVar30 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pbVar30 + 1;
      *pbVar30 = bVar27;
      bVar27 = pbVar31[1];
      pbVar31 = pbVar31 + 2;
      goto LAB_00109673;
    }
    if ((bVar27 & 0xf0) == 0xe0) {
      pbVar30 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pbVar30 + 1;
      *pbVar30 = bVar27;
      bVar27 = pbVar31[1];
      pbVar30 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pbVar30 + 1;
      *pbVar30 = bVar27;
      bVar27 = pbVar31[2];
      pbVar31 = pbVar31 + 3;
      goto LAB_00109673;
    }
    if ((bVar27 & 0xf8) == 0xf0) {
      pbVar30 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pbVar30 + 1;
      *pbVar30 = bVar27;
      bVar27 = pbVar31[1];
      pbVar30 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pbVar30 + 1;
      *pbVar30 = bVar27;
      bVar27 = pbVar31[2];
      pbVar30 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pbVar30 + 1;
      *pbVar30 = bVar27;
      bVar27 = pbVar31[3];
      pbVar31 = pbVar31 + 4;
      goto LAB_00109673;
    }
  }
  else {
    pbVar31 = pbVar31 + 1;
LAB_00109673:
    pbVar30 = (emitter->buffer).pointer;
    (emitter->buffer).pointer = pbVar30 + 1;
    *pbVar30 = bVar27;
  }
  emitter->column = 0;
  emitter->line = emitter->line + 1;
LAB_00109691:
  iVar11 = 1;
LAB_00109696:
  emitter->indention = iVar11;
  if (pbVar31 == pbVar21) goto LAB_001099f8;
  goto LAB_0010923d;
LAB_00109a00:
  bVar6 = false;
  goto LAB_00109a03;
}

Assistant:

static int
yaml_emitter_emit_node(yaml_emitter_t *emitter, yaml_event_t *event,
        int root, int sequence, int mapping, int simple_key)
{
    emitter->root_context = root;
    emitter->sequence_context = sequence;
    emitter->mapping_context = mapping;
    emitter->simple_key_context = simple_key;

    switch (event->type)
    {
        case YAML_ALIAS_EVENT:
            return yaml_emitter_emit_alias(emitter, event);

        case YAML_SCALAR_EVENT:
            return yaml_emitter_emit_scalar(emitter, event);

        case YAML_SEQUENCE_START_EVENT:
            return yaml_emitter_emit_sequence_start(emitter, event);

        case YAML_MAPPING_START_EVENT:
            return yaml_emitter_emit_mapping_start(emitter, event);

        default:
            return yaml_emitter_set_emitter_error(emitter,
                    "expected SCALAR, SEQUENCE-START, MAPPING-START, or ALIAS");
    }

    return 0;
}